

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * coda_strxstr(char *s,char *n,size_t len)

{
  char cVar1;
  __int32_t *p_Var2;
  size_t sVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar1 = *n;
    if ((long)cVar1 == 0) {
      return s;
    }
    sVar3 = strlen(n);
    if ((sVar3 <= len) && (0 < (long)len)) {
      pcVar8 = s + len;
      pp_Var4 = __ctype_tolower_loc();
      p_Var2 = *pp_Var4;
      pcVar5 = s + 1;
      do {
        if (p_Var2[*s] == p_Var2[cVar1]) {
          pcVar6 = n;
          pcVar7 = pcVar5;
          if (s < pcVar8 && 0 < (long)sVar3) {
            do {
              if ((p_Var2[pcVar7[-1]] != p_Var2[*pcVar6]) || (pcVar6 = pcVar6 + 1, pcVar8 <= pcVar7)
                 ) break;
              pcVar7 = pcVar7 + 1;
            } while (pcVar6 < n + sVar3);
          }
          if (pcVar6 == n + sVar3) {
            return s;
          }
        }
        s = s + 1;
        pcVar5 = pcVar5 + 1;
      } while (s < pcVar8);
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_strxstr(const char *s, const char *n, size_t len)
{
	const char *w;
	const char *x;
	const char *es;
	const char *en;
	size_t nsz;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;
	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}